

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsWebServer.cpp
# Opt level: O0

void __thiscall helics::apps::WebServer::processArgs(WebServer *this,string_view args)

{
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values;
  App *pAVar1;
  string *psVar2;
  string *option_name;
  Option *pOVar3;
  int *flag_result;
  Option *pOVar4;
  Option *pOVar5;
  string *psVar6;
  long in_RDI;
  Error *ce;
  Option *niflag;
  App *websub;
  App *httpsub;
  App parser;
  Validator *in_stack_fffffffffffff288;
  App *in_stack_fffffffffffff290;
  allocator<char> *in_stack_fffffffffffff2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__a;
  char *in_stack_fffffffffffff2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  char (*in_stack_fffffffffffff2d8) [9];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff2e0;
  string *in_stack_fffffffffffff340;
  string *in_stack_fffffffffffff348;
  App *in_stack_fffffffffffff350;
  string *in_stack_fffffffffffff398;
  string *option_description;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff3a0;
  string *in_stack_fffffffffffff3a8;
  App *in_stack_fffffffffffff3b0;
  App *this_01;
  string *in_stack_fffffffffffff400;
  string *in_stack_fffffffffffff408;
  App *in_stack_fffffffffffff410;
  allocator<char> in_stack_fffffffffffff517;
  string *in_stack_fffffffffffff518;
  App *in_stack_fffffffffffff520;
  allocator<char> local_ac1 [33];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_aa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a98 [2];
  undefined1 local_a58 [64];
  undefined1 local_a18 [64];
  undefined1 local_9d8 [64];
  undefined1 local_998 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_958 [7];
  undefined1 local_871 [40];
  undefined1 local_849 [80];
  allocator<char> local_7f9 [40];
  allocator<char> local_7d1 [48];
  allocator<char> local_7a1 [40];
  string local_779;
  string local_751;
  allocator<char> local_729 [40];
  allocator<char> local_701 [40];
  allocator<char> local_6d9 [33];
  App *local_6b8;
  string local_6a9;
  undefined1 local_681 [80];
  allocator<char> local_631 [40];
  allocator<char> local_609 [40];
  allocator<char> local_5e1 [40];
  allocator<char> local_5b9 [40];
  string local_591;
  undefined1 local_569 [80];
  allocator<char> local_519 [40];
  allocator<char> local_4f1 [33];
  App *local_4d0;
  allocator<char> local_4c1 [40];
  allocator<char> local_499 [40];
  allocator<char> local_471 [40];
  allocator<char> local_449 [40];
  allocator<char> local_421 [40];
  allocator<char> local_3f9 [40];
  allocator<char> local_3d1 [56];
  allocator<char> local_399 [33];
  App local_378;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  CLI::App::App(in_stack_fffffffffffff350,in_stack_fffffffffffff348,in_stack_fffffffffffff340);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff290);
  std::allocator<char>::~allocator(local_3d1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff290);
  std::allocator<char>::~allocator(local_399);
  CLI::App::allow_extras(&local_378,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
            (in_stack_fffffffffffff3b0,in_stack_fffffffffffff3a8,(int *)in_stack_fffffffffffff3a0,
             in_stack_fffffffffffff398);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  CLI::Option::envname((Option *)in_stack_fffffffffffff290,(string *)in_stack_fffffffffffff288);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff290);
  std::allocator<char>::~allocator(local_449);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff290);
  std::allocator<char>::~allocator(local_421);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff290);
  std::allocator<char>::~allocator(local_3f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (in_stack_fffffffffffff3b0,in_stack_fffffffffffff3a8,in_stack_fffffffffffff3a0,
             in_stack_fffffffffffff398);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  CLI::Option::envname((Option *)in_stack_fffffffffffff290,(string *)in_stack_fffffffffffff288);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff290);
  std::allocator<char>::~allocator(local_4c1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff290);
  std::allocator<char>::~allocator(local_499);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff290);
  std::allocator<char>::~allocator(local_471);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  pAVar1 = CLI::App::add_subcommand
                     (in_stack_fffffffffffff410,in_stack_fffffffffffff408,in_stack_fffffffffffff400)
  ;
  pAVar1 = CLI::App::fallthrough(pAVar1,true);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff290);
  std::allocator<char>::~allocator(local_519);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff290);
  std::allocator<char>::~allocator(local_4f1);
  local_4d0 = pAVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  psVar2 = (string *)(in_RDI + 0xb8);
  pAVar1 = (App *)local_569;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
            (in_stack_fffffffffffff3b0,in_stack_fffffffffffff3a8,(int *)in_stack_fffffffffffff3a0,
             in_stack_fffffffffffff398);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff290);
  std::allocator<char>::~allocator((allocator<char> *)local_569);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff290);
  std::allocator<char>::~allocator((allocator<char> *)(local_569 + 0x28));
  psVar6 = &local_591;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (in_stack_fffffffffffff3b0,in_stack_fffffffffffff3a8,in_stack_fffffffffffff3a0,
             in_stack_fffffffffffff398);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff290);
  std::allocator<char>::~allocator(local_5b9);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff290);
  std::allocator<char>::~allocator((allocator<char> *)&local_591);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
            (in_stack_fffffffffffff3b0,in_stack_fffffffffffff3a8,(int *)in_stack_fffffffffffff3a0,
             in_stack_fffffffffffff398);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  CLI::Option::envname((Option *)in_stack_fffffffffffff290,(string *)in_stack_fffffffffffff288);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff290);
  std::allocator<char>::~allocator(local_631);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff290);
  std::allocator<char>::~allocator(local_609);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff290);
  std::allocator<char>::~allocator(local_5e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  option_name = (string *)(in_RDI + 0xc0);
  this_01 = (App *)local_681;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  pOVar3 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (this_01,option_name,in_stack_fffffffffffff3a0,in_stack_fffffffffffff398);
  option_description = &local_6a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  CLI::Option::envname((Option *)in_stack_fffffffffffff290,(string *)in_stack_fffffffffffff288);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff290);
  std::allocator<char>::~allocator((allocator<char> *)&local_6a9);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff290);
  std::allocator<char>::~allocator((allocator<char> *)local_681);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff290);
  std::allocator<char>::~allocator((allocator<char> *)(local_681 + 0x28));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  pAVar1 = CLI::App::add_subcommand(pAVar1,psVar2,psVar6);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff290);
  std::allocator<char>::~allocator(local_701);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff290);
  std::allocator<char>::~allocator(local_6d9);
  local_6b8 = pAVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  flag_result = (int *)(in_RDI + 0xe0);
  psVar6 = &local_751;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
            (this_01,option_name,(int *)pOVar3,option_description);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff290);
  std::allocator<char>::~allocator((allocator<char> *)&local_751);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff290);
  std::allocator<char>::~allocator(local_729);
  psVar2 = &local_779;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (this_01,option_name,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pOVar3,
             option_description);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff290);
  std::allocator<char>::~allocator(local_7a1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff290);
  std::allocator<char>::~allocator((allocator<char> *)&local_779);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  pOVar4 = CLI::App::add_flag<int,_(CLI::detail::enabler)0>(pAVar1,psVar6,flag_result,psVar2);
  CLI::Option::disable_flag_override(pOVar4,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  pOVar5 = CLI::Option::envname
                     ((Option *)in_stack_fffffffffffff290,(string *)in_stack_fffffffffffff288);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff290);
  std::allocator<char>::~allocator((allocator<char> *)(local_849 + 0x28));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff290);
  std::allocator<char>::~allocator(local_7f9);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff290);
  std::allocator<char>::~allocator(local_7d1);
  pOVar4 = (Option *)local_849;
  local_7d1._33_8_ = pOVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  psVar6 = (string *)(in_RDI + 0xe8);
  pOVar5 = (Option *)local_871;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  pOVar3 = CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
                     (this_01,option_name,(int *)pOVar3,option_description);
  local_aa0 = local_a98;
  CLI::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_const_char_(&)[2],_true>
            (in_stack_fffffffffffff2e0,(char (*) [6])in_stack_fffffffffffff2d8,
             (char (*) [2])in_stack_fffffffffffff2d0);
  local_aa0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a58;
  CLI::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_const_char_(&)[2],_true>
            (in_stack_fffffffffffff2e0,(char (*) [5])in_stack_fffffffffffff2d8,
             (char (*) [2])in_stack_fffffffffffff2d0);
  local_aa0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a18;
  CLI::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_const_char_(&)[2],_true>
            (in_stack_fffffffffffff2e0,(char (*) [5])in_stack_fffffffffffff2d8,
             (char (*) [2])in_stack_fffffffffffff2d0);
  local_aa0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9d8;
  CLI::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[9],_const_char_(&)[3],_true>
            (in_stack_fffffffffffff2e0,in_stack_fffffffffffff2d8,
             (char (*) [3])in_stack_fffffffffffff2d0);
  local_aa0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_998;
  CLI::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[4],_const_char_(&)[3],_true>
            (in_stack_fffffffffffff2e0,(char (*) [4])in_stack_fffffffffffff2d8,
             (char (*) [3])in_stack_fffffffffffff2d0);
  local_958[0]._M_dataplus._M_p = (pointer)local_a98;
  local_958[0]._M_string_length = 5;
  values._M_len = (size_type)psVar6;
  values._M_array = (iterator)pOVar3;
  CLI::CheckedTransformer::CheckedTransformer<>
            ((CheckedTransformer *)in_stack_fffffffffffff2e0,values);
  CLI::Validator::Validator((Validator *)in_stack_fffffffffffff290,in_stack_fffffffffffff288);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  CLI::Option::transform(pOVar4,(Validator *)pOVar5,psVar6);
  CLI::Option::excludes(pOVar4,pOVar5);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff290);
  std::allocator<char>::~allocator(local_ac1);
  CLI::Validator::~Validator((Validator *)in_stack_fffffffffffff290);
  CLI::CheckedTransformer::~CheckedTransformer((CheckedTransformer *)0x218bce);
  __t = local_a98;
  __a = local_958;
  do {
    __a = __a + -2;
    CLI::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_fffffffffffff290);
  } while (__a != __t);
  this_00 = __a;
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff290);
  std::allocator<char>::~allocator((allocator<char> *)local_871);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff290);
  std::allocator<char>::~allocator((allocator<char> *)local_849);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (this_00,(basic_string_view<char,_std::char_traits<char>_> *)__t,(allocator<char> *)__a)
  ;
  CLI::App::parse(in_stack_fffffffffffff520,in_stack_fffffffffffff518,
                  (bool)in_stack_fffffffffffff517);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff290);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff517);
  CLI::App::~App(in_stack_fffffffffffff290);
  return;
}

Assistant:

void WebServer::processArgs(std::string_view args)

{
    CLI::App parser("http web server parser");
    parser.allow_extras();
    parser.add_option("--http_port", mHttpPort, "specify the http port to use")
        ->envname("HELICS_HTTP_PORT");
    parser
        .add_option("--http_interface",
                    mHttpAddress,
                    "specify the interface for the http server to listen on for connections")
        ->envname("HELICS_HTTP_ADDRESS");
    auto* httpsub = parser.add_subcommand("http")->fallthrough();
    httpsub->add_option("--port", mHttpPort, "specify the http port to use");
    httpsub->add_option("--interface",
                        mHttpAddress,
                        "specify the interface for the http server to listen on for connections");

    parser.add_option("--websocket_port", mWebsocketPort, "specify the websocket port to use")
        ->envname("HELICS_WEBSOCKET_PORT");
    parser
        .add_option("--websocket_interface",
                    mWebsocketAddress,
                    "specify the interface for the websocket server to listen on for connections")
        ->envname("HELICS_WEBSOCKET_ADDRESS");

    auto* websub = parser.add_subcommand("websocket");
    websub->add_option("--port", mWebsocketPort, "specify the websocket port to use");
    websub->add_option(
        "--interface",
        mWebsocketAddress,
        "specify the interface for the websocket server to listen on for connections");
    auto* niflag = parser
                       .add_flag("--local{0},--ipv4{4},--ipv6{6},--all{10},--external{10}",
                                 mInterfaceNetwork,
                                 "specify external interface to use, default is --local")
                       ->disable_flag_override()
                       ->envname("HELICS_WEBSERVER_INTERFACE");

    parser
        .add_option("--network_connectivity",
                    mInterfaceNetwork,
                    "specify the connectivity of the network interface")
        ->transform(CLI::CheckedTransformer(
            {{"local", "0"}, {"ipv4", "4"}, {"ipv6", "6"}, {"external", "10"}, {"all", "10"}}))
        ->excludes(niflag);

    try {
        parser.parse(std::string(args));
    }
    catch (const CLI::Error& ce) {
        logMessage(std::string("error processing command line arguments for web server :") +
                   ce.what());
    }
}